

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::advance_head(Consume *this)

{
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  *this_00;
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  ulong uVar3;
  ControlBlock *i_page;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  this_00 = this->m_queue;
  pCVar1 = this->m_control;
  pCVar2 = this_00->m_head;
  if (pCVar2 == pCVar1) {
    uVar3 = this->m_next_ptr;
    this_00->m_head = (ControlBlock *)(uVar3 & 0xfffffffffffffff0);
    if ((uVar3 & 4) != 0) {
      basic_default_allocator<65536UL>::deallocate
                ((basic_default_allocator<65536UL> *)this_00,(void *)pCVar1[3].m_next,
                 pCVar1[4].m_next,pCVar1[5].m_next,0);
    }
    uVar4 = (ulong)this->m_control ^ uVar3;
    if (((uVar3 & 0xfff0) == 0) == uVar4 < 0x10000) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
    }
    if (0xffff < uVar4) {
      i_page = this->m_control;
      PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::
      deallocate_page<(density::detail::page_allocation_type)0>
                ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                 (*in_FS_OFFSET + -0xc0),i_page);
    }
  }
  return pCVar2 == pCVar1;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }